

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header_list.cc
# Opt level: O3

Header * __thiscall
wave::HeaderList::header(Header *__return_storage_ptr__,HeaderList *this,string *header_id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  int iVar4;
  bool bVar5;
  Iterator IVar6;
  Iterator IVar7;
  Iterator iterator;
  Iterator local_60;
  string local_50;
  
  local_60.position_ = 0;
  local_60.stream_ = &this->stream_;
  IVar6 = end(this);
  if (IVar6.stream_ != &this->stream_ || IVar6.position_ != 0) {
    paVar1 = &(__return_storage_ptr__->id_).field_2;
    do {
      Iterator::operator*(__return_storage_ptr__,&local_60);
      Header::chunk_id_abi_cxx11_(&local_50,__return_storage_ptr__);
      _Var3._M_p = local_50._M_dataplus._M_p;
      if (local_50._M_string_length == header_id->_M_string_length) {
        if (local_50._M_string_length == 0) {
          bVar5 = true;
        }
        else {
          iVar4 = bcmp(local_50._M_dataplus._M_p,(header_id->_M_dataplus)._M_p,
                       local_50._M_string_length);
          bVar5 = iVar4 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var3._M_p != &local_50.field_2) {
        operator_delete(_Var3._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar5) {
        return __return_storage_ptr__;
      }
      pcVar2 = (__return_storage_ptr__->id_)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      Iterator::operator++(&local_60);
      IVar7 = end(this);
      IVar6.position_ = local_60.position_;
      IVar6.stream_ = local_60.stream_;
    } while (IVar7 != IVar6);
  }
  local_50._M_string_length = 0;
  local_50._M_dataplus._M_p = (pointer)this;
  Iterator::operator*(__return_storage_ptr__,(Iterator *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

Header HeaderList::header(const std::string& header_id) {
  for (auto iterator = begin(); iterator != end(); iterator++) {
    auto header = *iterator;
    if (header.chunk_id() == header_id) {
      return header;
    }
  }
  return *begin();
}